

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void av1_lowbd_fwd_txfm2d_8x32_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  short *psVar1;
  int32_t *piVar2;
  byte bVar3;
  code *pcVar4;
  code *pcVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined8 uVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  long lVar28;
  uint uVar29;
  uint uVar30;
  undefined7 in_register_00000009;
  undefined8 *puVar31;
  long lVar32;
  int32_t *piVar33;
  undefined8 *puVar34;
  undefined4 uVar35;
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar44 [16];
  undefined4 uVar45;
  undefined1 auVar47 [12];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar50 [16];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined4 uVar89;
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [12];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined4 uVar122;
  undefined1 auVar124 [12];
  undefined1 auVar125 [12];
  undefined1 auVar126 [12];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar135 [16];
  undefined1 auVar138 [16];
  undefined1 auVar141 [16];
  __m128i buf0 [32];
  __m128i buf1 [32];
  undefined8 uStack_448;
  byte *local_440;
  undefined8 local_438 [2];
  undefined2 local_428;
  undefined2 uStack_426;
  undefined2 uStack_424;
  undefined2 uStack_422;
  undefined2 uStack_420;
  undefined2 uStack_41e;
  undefined2 uStack_41c;
  undefined2 uStack_41a;
  undefined1 local_418 [16];
  undefined2 local_408;
  undefined2 uStack_406;
  undefined2 uStack_404;
  undefined2 uStack_402;
  undefined2 uStack_400;
  undefined2 uStack_3fe;
  undefined2 uStack_3fc;
  undefined2 uStack_3fa;
  undefined1 local_3f8 [14];
  undefined2 local_3e8;
  undefined2 uStack_3e6;
  undefined2 uStack_3e4;
  undefined2 uStack_3e2;
  undefined2 uStack_3e0;
  undefined2 uStack_3de;
  undefined2 uStack_3dc;
  undefined1 local_3d8 [14];
  undefined2 local_3c8;
  undefined2 uStack_3c6;
  undefined2 uStack_3c4;
  undefined2 uStack_3c2;
  undefined2 uStack_3c0;
  undefined2 uStack_3be;
  undefined2 uStack_3bc;
  undefined1 local_3b8 [16];
  undefined2 local_3a8;
  undefined2 uStack_3a6;
  undefined2 uStack_3a4;
  undefined2 uStack_3a2;
  undefined2 uStack_3a0;
  undefined2 uStack_39e;
  undefined2 uStack_39c;
  undefined2 uStack_39a;
  undefined1 local_398 [16];
  undefined2 local_388;
  undefined2 uStack_386;
  undefined2 uStack_384;
  undefined2 uStack_382;
  undefined2 uStack_380;
  undefined2 uStack_37e;
  undefined2 uStack_37c;
  undefined2 uStack_37a;
  undefined1 local_378 [14];
  undefined2 local_368;
  undefined2 uStack_366;
  undefined2 uStack_364;
  undefined2 uStack_362;
  undefined2 uStack_360;
  undefined2 uStack_35e;
  undefined2 uStack_35c;
  undefined1 local_358 [14];
  undefined2 local_348;
  undefined2 uStack_346;
  undefined2 uStack_344;
  undefined2 uStack_342;
  undefined2 uStack_340;
  undefined2 uStack_33e;
  undefined2 uStack_33c;
  undefined1 local_338 [16];
  undefined2 local_328;
  undefined2 uStack_326;
  undefined2 uStack_324;
  undefined2 uStack_322;
  undefined2 uStack_320;
  undefined2 uStack_31e;
  undefined2 uStack_31c;
  undefined2 uStack_31a;
  undefined1 local_318 [16];
  undefined2 local_308;
  undefined2 uStack_306;
  undefined2 uStack_304;
  undefined2 uStack_302;
  undefined2 uStack_300;
  undefined2 uStack_2fe;
  undefined2 uStack_2fc;
  undefined2 uStack_2fa;
  undefined1 local_2f8 [14];
  undefined2 local_2e8;
  undefined2 uStack_2e6;
  undefined2 uStack_2e4;
  undefined2 uStack_2e2;
  undefined2 uStack_2e0;
  undefined2 uStack_2de;
  undefined2 uStack_2dc;
  undefined1 local_2d8 [14];
  undefined2 local_2c8;
  undefined2 uStack_2c6;
  undefined2 uStack_2c4;
  undefined2 uStack_2c2;
  undefined2 uStack_2c0;
  undefined2 uStack_2be;
  undefined2 uStack_2bc;
  undefined1 local_2b8 [16];
  undefined2 local_2a8;
  undefined2 uStack_2a6;
  undefined2 uStack_2a4;
  undefined2 uStack_2a2;
  undefined2 uStack_2a0;
  undefined2 uStack_29e;
  undefined2 uStack_29c;
  undefined2 uStack_29a;
  undefined1 local_298 [16];
  undefined2 local_288;
  undefined2 uStack_286;
  undefined2 uStack_284;
  undefined2 uStack_282;
  undefined2 uStack_280;
  undefined2 uStack_27e;
  undefined2 uStack_27c;
  undefined2 uStack_27a;
  undefined1 local_278 [16];
  undefined2 local_268;
  undefined2 uStack_266;
  undefined2 uStack_264;
  undefined2 uStack_262;
  undefined2 uStack_260;
  undefined2 uStack_25e;
  undefined2 uStack_25c;
  undefined2 uStack_25a;
  undefined1 local_258 [16];
  undefined2 local_248;
  undefined2 uStack_246;
  undefined2 uStack_244;
  undefined2 uStack_242;
  undefined2 uStack_240;
  undefined2 uStack_23e;
  undefined2 uStack_23c;
  undefined2 uStack_23a;
  undefined8 local_238 [4];
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined1 auVar36 [12];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar46 [12];
  undefined1 auVar54 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar75 [16];
  undefined1 auVar79 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [12];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar108 [16];
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar123 [12];
  undefined1 auVar127 [16];
  undefined1 auVar133 [16];
  undefined1 auVar136 [16];
  undefined1 auVar139 [16];
  undefined1 auVar142 [16];
  undefined1 auVar134 [16];
  undefined1 auVar137 [16];
  undefined1 auVar140 [16];
  undefined1 auVar143 [16];
  
  local_440 = (byte *)av1_fwd_txfm_shift_ls[0xf];
  uVar30 = (uint)CONCAT71(in_register_00000009,tx_type);
  uStack_448._4_4_ = 0;
  if (uVar30 < 0x10) {
    if ((0x4110U >> (uVar30 & 0x1f) & 1) != 0) {
LAB_004ba93c:
      lVar32 = 0x200;
      do {
        uVar10 = *(undefined8 *)(input + 4);
        *(undefined8 *)((long)&uStack_448 + lVar32) = *(undefined8 *)input;
        *(undefined8 *)((long)&local_440 + lVar32) = uVar10;
        input = input + stride;
        lVar32 = lVar32 + -0x10;
      } while (lVar32 != 0);
      goto LAB_004ba959;
    }
    if ((0x80a0U >> (uVar30 & 0x1f) & 1) == 0) {
      if (uVar30 == 6) {
        uStack_448._4_4_ = 1;
        goto LAB_004ba93c;
      }
    }
    else {
      uStack_448._4_4_ = 1;
    }
  }
  lVar32 = 0;
  do {
    uVar10 = *(undefined8 *)(input + 4);
    *(undefined8 *)((long)local_438 + lVar32) = *(undefined8 *)input;
    *(undefined8 *)((long)local_438 + lVar32 + 8) = uVar10;
    lVar32 = lVar32 + 0x10;
    input = input + stride;
  } while (lVar32 != 0x200);
LAB_004ba959:
  pcVar4 = *(code **)((long)col_txfm8x32_arr + (ulong)(uVar30 * 8));
  bVar3 = *local_440;
  uVar29 = (uint)(char)bVar3;
  if ((int)uVar29 < 0) {
    auVar50 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
    auVar50 = pshuflw(auVar50,auVar50,0);
    auVar50._4_4_ = auVar50._0_4_;
    auVar50._8_4_ = auVar50._0_4_;
    auVar50._12_4_ = auVar50._0_4_;
    lVar32 = 0;
    do {
      auVar56 = paddsw(*(undefined1 (*) [16])((long)local_438 + lVar32),auVar50);
      auVar56 = psraw(auVar56,ZEXT416(-uVar29));
      *(undefined1 (*) [16])((long)local_438 + lVar32) = auVar56;
      lVar32 = lVar32 + 0x10;
    } while (lVar32 != 0x200);
  }
  else if (bVar3 != 0) {
    lVar32 = 0;
    do {
      auVar50 = psllw(*(undefined1 (*) [16])((long)local_438 + lVar32),ZEXT416(uVar29));
      *(undefined1 (*) [16])((long)local_438 + lVar32) = auVar50;
      lVar32 = lVar32 + 0x10;
    } while (lVar32 != 0x200);
  }
  pcVar5 = *(code **)((long)row_txfm8x8_arr + (ulong)(uVar30 * 8));
  (*pcVar4)(local_438,local_438,0xc);
  bVar3 = local_440[1];
  uVar30 = (uint)(char)bVar3;
  if ((int)uVar30 < 0) {
    auVar50 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
    auVar50 = pshuflw(auVar50,auVar50,0);
    auVar56._0_4_ = auVar50._0_4_;
    auVar56._4_4_ = auVar56._0_4_;
    auVar56._8_4_ = auVar56._0_4_;
    auVar56._12_4_ = auVar56._0_4_;
    lVar32 = 0;
    do {
      auVar50 = paddsw(*(undefined1 (*) [16])((long)local_438 + lVar32),auVar56);
      auVar50 = psraw(auVar50,ZEXT416(-uVar30));
      *(undefined1 (*) [16])((long)local_438 + lVar32) = auVar50;
      lVar32 = lVar32 + 0x10;
    } while (lVar32 != 0x200);
  }
  else if (bVar3 != 0) {
    lVar32 = 0;
    do {
      auVar50 = psllw(*(undefined1 (*) [16])((long)local_438 + lVar32),ZEXT416(uVar30));
      *(undefined1 (*) [16])((long)local_438 + lVar32) = auVar50;
      lVar32 = lVar32 + 0x10;
    } while (lVar32 != 0x200);
  }
  auVar60._0_12_ = local_438._0_12_;
  auVar60._12_2_ = local_438[0]._6_2_;
  auVar60._14_2_ = uStack_422;
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._0_10_ = local_438._0_10_;
  auVar59._10_2_ = uStack_424;
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._0_8_ = local_438[0];
  auVar58._8_2_ = local_438[0]._4_2_;
  auVar11._4_8_ = auVar58._8_8_;
  auVar11._2_2_ = uStack_426;
  auVar11._0_2_ = local_438[0]._2_2_;
  auVar57._0_4_ = CONCAT22(local_428,(short)local_438[0]);
  auVar57._4_12_ = auVar11;
  auVar108._0_12_ = local_418._0_12_;
  auVar108._12_2_ = local_418._6_2_;
  auVar108._14_2_ = uStack_402;
  auVar107._12_4_ = auVar108._12_4_;
  auVar107._0_10_ = local_418._0_10_;
  auVar107._10_2_ = uStack_404;
  auVar106._10_6_ = auVar107._10_6_;
  auVar106._0_8_ = local_418._0_8_;
  auVar106._8_2_ = local_418._4_2_;
  auVar12._4_8_ = auVar106._8_8_;
  auVar12._2_2_ = uStack_406;
  auVar12._0_2_ = local_418._2_2_;
  auVar76._0_12_ = local_3f8._0_12_;
  auVar76._12_2_ = local_3f8._6_2_;
  auVar76._14_2_ = uStack_3e2;
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._0_10_ = local_3f8._0_10_;
  auVar75._10_2_ = uStack_3e4;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._0_8_ = local_3f8._0_8_;
  auVar74._8_2_ = local_3f8._4_2_;
  auVar13._4_8_ = auVar74._8_8_;
  auVar13._2_2_ = uStack_3e6;
  auVar13._0_2_ = local_3f8._2_2_;
  auVar73._0_4_ = CONCAT22(local_3e8,local_3f8._0_2_);
  auVar73._4_12_ = auVar13;
  auVar134._0_12_ = local_3d8._0_12_;
  auVar134._12_2_ = local_3d8._6_2_;
  auVar134._14_2_ = uStack_3c2;
  auVar133._12_4_ = auVar134._12_4_;
  auVar133._0_10_ = local_3d8._0_10_;
  auVar133._10_2_ = uStack_3c4;
  auVar132._10_6_ = auVar133._10_6_;
  auVar132._0_8_ = local_3d8._0_8_;
  auVar132._8_2_ = local_3d8._4_2_;
  auVar14._4_8_ = auVar132._8_8_;
  auVar14._2_2_ = uStack_3c6;
  auVar14._0_2_ = local_3d8._2_2_;
  uVar35 = CONCAT22(uStack_420,(short)local_438[1]);
  auVar36._0_8_ = CONCAT26(uStack_41e,CONCAT24(local_438[1]._2_2_,uVar35));
  auVar36._8_2_ = local_438[1]._4_2_;
  auVar36._10_2_ = uStack_41c;
  auVar40._12_2_ = local_438[1]._6_2_;
  auVar40._0_12_ = auVar36;
  auVar40._14_2_ = uStack_41a;
  uVar89 = CONCAT22(uStack_400,local_418._8_2_);
  auVar90._0_8_ = CONCAT26(uStack_3fe,CONCAT24(local_418._10_2_,uVar89));
  auVar90._8_2_ = local_418._12_2_;
  auVar90._10_2_ = uStack_3fc;
  auVar94._12_2_ = local_418._14_2_;
  auVar94._0_12_ = auVar90;
  auVar94._14_2_ = uStack_3fa;
  uVar45 = CONCAT22(uStack_3e0,local_3f8._8_2_);
  auVar46._0_8_ = CONCAT26(uStack_3de,CONCAT24(local_3f8._10_2_,uVar45));
  auVar46._8_2_ = local_3f8._12_2_;
  auVar46._10_2_ = uStack_3dc;
  uVar122 = CONCAT22(uStack_3c0,local_3d8._8_2_);
  auVar123._0_8_ = CONCAT26(uStack_3be,CONCAT24(local_3d8._10_2_,uVar122));
  auVar123._8_2_ = local_3d8._12_2_;
  auVar123._10_2_ = uStack_3bc;
  auVar98._0_8_ = auVar57._0_8_;
  auVar98._8_4_ = auVar11._0_4_;
  auVar98._12_4_ = auVar12._0_4_;
  auVar102._0_8_ = auVar73._0_8_;
  auVar102._8_4_ = auVar13._0_4_;
  auVar102._12_4_ = auVar14._0_4_;
  auVar118._8_4_ = (int)((ulong)auVar36._0_8_ >> 0x20);
  auVar118._0_8_ = auVar36._0_8_;
  auVar118._12_4_ = (int)((ulong)auVar90._0_8_ >> 0x20);
  auVar128._8_4_ = (int)((ulong)auVar46._0_8_ >> 0x20);
  auVar128._0_8_ = auVar46._0_8_;
  auVar128._12_4_ = (int)((ulong)auVar123._0_8_ >> 0x20);
  puVar34 = local_238;
  local_238[0] = CONCAT44(CONCAT22(local_408,local_418._0_2_),auVar57._0_4_);
  local_238[1] = CONCAT44(CONCAT22(local_3c8,local_3d8._0_2_),auVar73._0_4_);
  local_238[2] = auVar98._8_8_;
  local_238[3] = auVar102._8_8_;
  local_218 = auVar58._8_4_;
  uStack_214 = auVar106._8_4_;
  uStack_210 = auVar74._8_4_;
  uStack_20c = auVar132._8_4_;
  uStack_200 = auVar59._12_4_;
  uStack_1fc = auVar107._12_4_;
  local_1f8 = CONCAT44(uVar89,uVar35);
  uStack_1f0 = CONCAT44(uVar122,uVar45);
  local_1e8 = auVar118._8_8_;
  uStack_1e0 = auVar128._8_8_;
  local_1d8 = auVar36._8_4_;
  uStack_1d4 = auVar90._8_4_;
  uStack_1d0 = auVar46._8_4_;
  uStack_1cc = auVar123._8_4_;
  uStack_1c0 = auVar40._12_4_;
  uStack_1bc = auVar94._12_4_;
  auVar64._0_12_ = local_3b8._0_12_;
  auVar64._12_2_ = local_3b8._6_2_;
  auVar64._14_2_ = uStack_3a2;
  auVar63._12_4_ = auVar64._12_4_;
  auVar63._0_10_ = local_3b8._0_10_;
  auVar63._10_2_ = uStack_3a4;
  auVar62._10_6_ = auVar63._10_6_;
  auVar62._0_8_ = local_3b8._0_8_;
  auVar62._8_2_ = local_3b8._4_2_;
  auVar15._4_8_ = auVar62._8_8_;
  auVar15._2_2_ = uStack_3a6;
  auVar15._0_2_ = local_3b8._2_2_;
  auVar61._0_4_ = CONCAT22(local_3a8,local_3b8._0_2_);
  auVar61._4_12_ = auVar15;
  auVar111._0_12_ = local_398._0_12_;
  auVar111._12_2_ = local_398._6_2_;
  auVar111._14_2_ = uStack_382;
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._0_10_ = local_398._0_10_;
  auVar110._10_2_ = uStack_384;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._0_8_ = local_398._0_8_;
  auVar109._8_2_ = local_398._4_2_;
  auVar16._4_8_ = auVar109._8_8_;
  auVar16._2_2_ = uStack_386;
  auVar16._0_2_ = local_398._2_2_;
  auVar80._0_12_ = local_378._0_12_;
  auVar80._12_2_ = local_378._6_2_;
  auVar80._14_2_ = uStack_362;
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._0_10_ = local_378._0_10_;
  auVar79._10_2_ = uStack_364;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._0_8_ = local_378._0_8_;
  auVar78._8_2_ = local_378._4_2_;
  auVar17._4_8_ = auVar78._8_8_;
  auVar17._2_2_ = uStack_366;
  auVar17._0_2_ = local_378._2_2_;
  auVar77._0_4_ = CONCAT22(local_368,local_378._0_2_);
  auVar77._4_12_ = auVar17;
  auVar137._0_12_ = local_358._0_12_;
  auVar137._12_2_ = local_358._6_2_;
  auVar137._14_2_ = uStack_342;
  auVar136._12_4_ = auVar137._12_4_;
  auVar136._0_10_ = local_358._0_10_;
  auVar136._10_2_ = uStack_344;
  auVar135._10_6_ = auVar136._10_6_;
  auVar135._0_8_ = local_358._0_8_;
  auVar135._8_2_ = local_358._4_2_;
  auVar18._4_8_ = auVar135._8_8_;
  auVar18._2_2_ = uStack_346;
  auVar18._0_2_ = local_358._2_2_;
  uVar35 = CONCAT22(uStack_3a0,local_3b8._8_2_);
  auVar37._0_8_ = CONCAT26(uStack_39e,CONCAT24(local_3b8._10_2_,uVar35));
  auVar37._8_2_ = local_3b8._12_2_;
  auVar37._10_2_ = uStack_39c;
  auVar41._12_2_ = local_3b8._14_2_;
  auVar41._0_12_ = auVar37;
  auVar41._14_2_ = uStack_39a;
  uVar89 = CONCAT22(uStack_380,local_398._8_2_);
  auVar91._0_8_ = CONCAT26(uStack_37e,CONCAT24(local_398._10_2_,uVar89));
  auVar91._8_2_ = local_398._12_2_;
  auVar91._10_2_ = uStack_37c;
  auVar95._12_2_ = local_398._14_2_;
  auVar95._0_12_ = auVar91;
  auVar95._14_2_ = uStack_37a;
  uVar45 = CONCAT22(uStack_360,local_378._8_2_);
  auVar47._0_8_ = CONCAT26(uStack_35e,CONCAT24(local_378._10_2_,uVar45));
  auVar47._8_2_ = local_378._12_2_;
  auVar47._10_2_ = uStack_35c;
  uVar122 = CONCAT22(uStack_340,local_358._8_2_);
  auVar124._0_8_ = CONCAT26(uStack_33e,CONCAT24(local_358._10_2_,uVar122));
  auVar124._8_2_ = local_358._12_2_;
  auVar124._10_2_ = uStack_33c;
  auVar99._0_8_ = auVar61._0_8_;
  auVar99._8_4_ = auVar15._0_4_;
  auVar99._12_4_ = auVar16._0_4_;
  auVar103._0_8_ = auVar77._0_8_;
  auVar103._8_4_ = auVar17._0_4_;
  auVar103._12_4_ = auVar18._0_4_;
  auVar119._8_4_ = (int)((ulong)auVar37._0_8_ >> 0x20);
  auVar119._0_8_ = auVar37._0_8_;
  auVar119._12_4_ = (int)((ulong)auVar91._0_8_ >> 0x20);
  auVar129._8_4_ = (int)((ulong)auVar47._0_8_ >> 0x20);
  auVar129._0_8_ = auVar47._0_8_;
  auVar129._12_4_ = (int)((ulong)auVar124._0_8_ >> 0x20);
  local_1b8 = CONCAT44(CONCAT22(local_388,local_398._0_2_),auVar61._0_4_);
  uStack_1b0 = CONCAT44(CONCAT22(local_348,local_358._0_2_),auVar77._0_4_);
  local_1a8 = auVar99._8_8_;
  uStack_1a0 = auVar103._8_8_;
  local_198 = auVar62._8_4_;
  uStack_194 = auVar109._8_4_;
  uStack_190 = auVar78._8_4_;
  uStack_18c = auVar135._8_4_;
  uStack_180 = auVar63._12_4_;
  uStack_17c = auVar110._12_4_;
  local_178 = CONCAT44(uVar89,uVar35);
  uStack_170 = CONCAT44(uVar122,uVar45);
  local_168 = auVar119._8_8_;
  uStack_160 = auVar129._8_8_;
  local_158 = auVar37._8_4_;
  uStack_154 = auVar91._8_4_;
  uStack_150 = auVar47._8_4_;
  uStack_14c = auVar124._8_4_;
  uStack_140 = auVar41._12_4_;
  uStack_13c = auVar95._12_4_;
  auVar68._0_12_ = local_338._0_12_;
  auVar68._12_2_ = local_338._6_2_;
  auVar68._14_2_ = uStack_322;
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._0_10_ = local_338._0_10_;
  auVar67._10_2_ = uStack_324;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._0_8_ = local_338._0_8_;
  auVar66._8_2_ = local_338._4_2_;
  auVar19._4_8_ = auVar66._8_8_;
  auVar19._2_2_ = uStack_326;
  auVar19._0_2_ = local_338._2_2_;
  auVar65._0_4_ = CONCAT22(local_328,local_338._0_2_);
  auVar65._4_12_ = auVar19;
  auVar114._0_12_ = local_318._0_12_;
  auVar114._12_2_ = local_318._6_2_;
  auVar114._14_2_ = uStack_302;
  auVar113._12_4_ = auVar114._12_4_;
  auVar113._0_10_ = local_318._0_10_;
  auVar113._10_2_ = uStack_304;
  auVar112._10_6_ = auVar113._10_6_;
  auVar112._0_8_ = local_318._0_8_;
  auVar112._8_2_ = local_318._4_2_;
  auVar20._4_8_ = auVar112._8_8_;
  auVar20._2_2_ = uStack_306;
  auVar20._0_2_ = local_318._2_2_;
  auVar84._0_12_ = local_2f8._0_12_;
  auVar84._12_2_ = local_2f8._6_2_;
  auVar84._14_2_ = uStack_2e2;
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._0_10_ = local_2f8._0_10_;
  auVar83._10_2_ = uStack_2e4;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._0_8_ = local_2f8._0_8_;
  auVar82._8_2_ = local_2f8._4_2_;
  auVar21._4_8_ = auVar82._8_8_;
  auVar21._2_2_ = uStack_2e6;
  auVar21._0_2_ = local_2f8._2_2_;
  auVar81._0_4_ = CONCAT22(local_2e8,local_2f8._0_2_);
  auVar81._4_12_ = auVar21;
  auVar140._0_12_ = local_2d8._0_12_;
  auVar140._12_2_ = local_2d8._6_2_;
  auVar140._14_2_ = uStack_2c2;
  auVar139._12_4_ = auVar140._12_4_;
  auVar139._0_10_ = local_2d8._0_10_;
  auVar139._10_2_ = uStack_2c4;
  auVar138._10_6_ = auVar139._10_6_;
  auVar138._0_8_ = local_2d8._0_8_;
  auVar138._8_2_ = local_2d8._4_2_;
  auVar22._4_8_ = auVar138._8_8_;
  auVar22._2_2_ = uStack_2c6;
  auVar22._0_2_ = local_2d8._2_2_;
  uVar35 = CONCAT22(uStack_320,local_338._8_2_);
  auVar38._0_8_ = CONCAT26(uStack_31e,CONCAT24(local_338._10_2_,uVar35));
  auVar38._8_2_ = local_338._12_2_;
  auVar38._10_2_ = uStack_31c;
  auVar42._12_2_ = local_338._14_2_;
  auVar42._0_12_ = auVar38;
  auVar42._14_2_ = uStack_31a;
  uVar89 = CONCAT22(uStack_300,local_318._8_2_);
  auVar92._0_8_ = CONCAT26(uStack_2fe,CONCAT24(local_318._10_2_,uVar89));
  auVar92._8_2_ = local_318._12_2_;
  auVar92._10_2_ = uStack_2fc;
  auVar96._12_2_ = local_318._14_2_;
  auVar96._0_12_ = auVar92;
  auVar96._14_2_ = uStack_2fa;
  uVar45 = CONCAT22(uStack_2e0,local_2f8._8_2_);
  auVar48._0_8_ = CONCAT26(uStack_2de,CONCAT24(local_2f8._10_2_,uVar45));
  auVar48._8_2_ = local_2f8._12_2_;
  auVar48._10_2_ = uStack_2dc;
  uVar122 = CONCAT22(uStack_2c0,local_2d8._8_2_);
  auVar125._0_8_ = CONCAT26(uStack_2be,CONCAT24(local_2d8._10_2_,uVar122));
  auVar125._8_2_ = local_2d8._12_2_;
  auVar125._10_2_ = uStack_2bc;
  auVar100._0_8_ = auVar65._0_8_;
  auVar100._8_4_ = auVar19._0_4_;
  auVar100._12_4_ = auVar20._0_4_;
  auVar104._0_8_ = auVar81._0_8_;
  auVar104._8_4_ = auVar21._0_4_;
  auVar104._12_4_ = auVar22._0_4_;
  auVar120._8_4_ = (int)((ulong)auVar38._0_8_ >> 0x20);
  auVar120._0_8_ = auVar38._0_8_;
  auVar120._12_4_ = (int)((ulong)auVar92._0_8_ >> 0x20);
  auVar130._8_4_ = (int)((ulong)auVar48._0_8_ >> 0x20);
  auVar130._0_8_ = auVar48._0_8_;
  auVar130._12_4_ = (int)((ulong)auVar125._0_8_ >> 0x20);
  local_138 = CONCAT44(CONCAT22(local_308,local_318._0_2_),auVar65._0_4_);
  uStack_130 = CONCAT44(CONCAT22(local_2c8,local_2d8._0_2_),auVar81._0_4_);
  local_128 = auVar100._8_8_;
  uStack_120 = auVar104._8_8_;
  local_118 = auVar66._8_4_;
  uStack_114 = auVar112._8_4_;
  uStack_110 = auVar82._8_4_;
  uStack_10c = auVar138._8_4_;
  uStack_100 = auVar67._12_4_;
  uStack_fc = auVar113._12_4_;
  local_f8 = CONCAT44(uVar89,uVar35);
  uStack_f0 = CONCAT44(uVar122,uVar45);
  local_e8 = auVar120._8_8_;
  uStack_e0 = auVar130._8_8_;
  local_d8 = auVar38._8_4_;
  uStack_d4 = auVar92._8_4_;
  uStack_d0 = auVar48._8_4_;
  uStack_cc = auVar125._8_4_;
  uStack_c0 = auVar42._12_4_;
  uStack_bc = auVar96._12_4_;
  auVar72._0_12_ = local_2b8._0_12_;
  auVar72._12_2_ = local_2b8._6_2_;
  auVar72._14_2_ = uStack_2a2;
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._0_10_ = local_2b8._0_10_;
  auVar71._10_2_ = uStack_2a4;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._0_8_ = local_2b8._0_8_;
  auVar70._8_2_ = local_2b8._4_2_;
  auVar23._4_8_ = auVar70._8_8_;
  auVar23._2_2_ = uStack_2a6;
  auVar23._0_2_ = local_2b8._2_2_;
  auVar69._0_4_ = CONCAT22(local_2a8,local_2b8._0_2_);
  auVar69._4_12_ = auVar23;
  auVar117._0_12_ = local_298._0_12_;
  auVar117._12_2_ = local_298._6_2_;
  auVar117._14_2_ = uStack_282;
  auVar116._12_4_ = auVar117._12_4_;
  auVar116._0_10_ = local_298._0_10_;
  auVar116._10_2_ = uStack_284;
  auVar115._10_6_ = auVar116._10_6_;
  auVar115._0_8_ = local_298._0_8_;
  auVar115._8_2_ = local_298._4_2_;
  auVar24._4_8_ = auVar115._8_8_;
  auVar24._2_2_ = uStack_286;
  auVar24._0_2_ = local_298._2_2_;
  auVar88._0_12_ = local_278._0_12_;
  auVar88._12_2_ = local_278._6_2_;
  auVar88._14_2_ = uStack_262;
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._0_10_ = local_278._0_10_;
  auVar87._10_2_ = uStack_264;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._0_8_ = local_278._0_8_;
  auVar86._8_2_ = local_278._4_2_;
  auVar25._4_8_ = auVar86._8_8_;
  auVar25._2_2_ = uStack_266;
  auVar25._0_2_ = local_278._2_2_;
  auVar85._0_4_ = CONCAT22(local_268,local_278._0_2_);
  auVar85._4_12_ = auVar25;
  auVar143._0_12_ = local_258._0_12_;
  auVar143._12_2_ = local_258._6_2_;
  auVar143._14_2_ = uStack_242;
  auVar142._12_4_ = auVar143._12_4_;
  auVar142._0_10_ = local_258._0_10_;
  auVar142._10_2_ = uStack_244;
  auVar141._10_6_ = auVar142._10_6_;
  auVar141._0_8_ = local_258._0_8_;
  auVar141._8_2_ = local_258._4_2_;
  auVar26._4_8_ = auVar141._8_8_;
  auVar26._2_2_ = uStack_246;
  auVar26._0_2_ = local_258._2_2_;
  uVar35 = CONCAT22(uStack_2a0,local_2b8._8_2_);
  auVar39._0_8_ = CONCAT26(uStack_29e,CONCAT24(local_2b8._10_2_,uVar35));
  auVar39._8_2_ = local_2b8._12_2_;
  auVar39._10_2_ = uStack_29c;
  auVar43._12_2_ = local_2b8._14_2_;
  auVar43._0_12_ = auVar39;
  auVar43._14_2_ = uStack_29a;
  uVar89 = CONCAT22(uStack_280,local_298._8_2_);
  auVar93._0_8_ = CONCAT26(uStack_27e,CONCAT24(local_298._10_2_,uVar89));
  auVar93._8_2_ = local_298._12_2_;
  auVar93._10_2_ = uStack_27c;
  auVar97._12_2_ = local_298._14_2_;
  auVar97._0_12_ = auVar93;
  auVar97._14_2_ = uStack_27a;
  uVar45 = CONCAT22(uStack_260,local_278._8_2_);
  auVar49._0_8_ = CONCAT26(uStack_25e,CONCAT24(local_278._10_2_,uVar45));
  auVar49._8_2_ = local_278._12_2_;
  auVar49._10_2_ = uStack_25c;
  auVar51._12_2_ = local_278._14_2_;
  auVar51._0_12_ = auVar49;
  auVar51._14_2_ = uStack_25a;
  uVar122 = CONCAT22(uStack_240,local_258._8_2_);
  auVar126._0_8_ = CONCAT26(uStack_23e,CONCAT24(local_258._10_2_,uVar122));
  auVar126._8_2_ = local_258._12_2_;
  auVar126._10_2_ = uStack_23c;
  auVar127._12_2_ = local_258._14_2_;
  auVar127._0_12_ = auVar126;
  auVar127._14_2_ = uStack_23a;
  auVar101._0_8_ = auVar69._0_8_;
  auVar101._8_4_ = auVar23._0_4_;
  auVar101._12_4_ = auVar24._0_4_;
  auVar105._0_8_ = auVar85._0_8_;
  auVar105._8_4_ = auVar25._0_4_;
  auVar105._12_4_ = auVar26._0_4_;
  auVar121._8_4_ = (int)((ulong)auVar39._0_8_ >> 0x20);
  auVar121._0_8_ = auVar39._0_8_;
  auVar121._12_4_ = (int)((ulong)auVar93._0_8_ >> 0x20);
  auVar131._8_4_ = (int)((ulong)auVar49._0_8_ >> 0x20);
  auVar131._0_8_ = auVar49._0_8_;
  auVar131._12_4_ = (int)((ulong)auVar126._0_8_ >> 0x20);
  local_b8 = CONCAT44(CONCAT22(local_288,local_298._0_2_),auVar69._0_4_);
  uStack_b0 = CONCAT44(CONCAT22(local_248,local_258._0_2_),auVar85._0_4_);
  local_a8 = auVar101._8_8_;
  uStack_a0 = auVar105._8_8_;
  local_98 = auVar70._8_4_;
  uStack_94 = auVar115._8_4_;
  uStack_90 = auVar86._8_4_;
  uStack_8c = auVar141._8_4_;
  uStack_80 = auVar71._12_4_;
  uStack_7c = auVar116._12_4_;
  local_78 = CONCAT44(uVar89,uVar35);
  uStack_70 = CONCAT44(uVar122,uVar45);
  local_68 = auVar121._8_8_;
  uStack_60 = auVar131._8_8_;
  local_58 = auVar39._8_4_;
  uStack_54 = auVar93._8_4_;
  uStack_50 = auVar49._8_4_;
  uStack_4c = auVar126._8_4_;
  uStack_40 = auVar43._12_4_;
  uStack_3c = auVar97._12_4_;
  uStack_38 = auVar51._12_4_;
  uStack_34 = auVar127._12_4_;
  piVar33 = output + 4;
  lVar32 = 0;
  do {
    if (uStack_448._4_4_ == 0) {
      puVar31 = local_238 + lVar32 * 0x10;
    }
    else {
      lVar28 = 0x80;
      puVar31 = puVar34;
      do {
        uVar10 = puVar31[1];
        *(undefined8 *)((long)&uStack_448 + lVar28) = *puVar31;
        *(undefined8 *)((long)&local_440 + lVar28) = uVar10;
        puVar31 = puVar31 + 2;
        lVar28 = lVar28 + -0x10;
      } while (lVar28 != 0);
      puVar31 = local_438;
    }
    (*pcVar5)(puVar31,puVar31,0xc);
    auVar52._8_8_ = extraout_XMM1_Qb;
    auVar52._0_8_ = extraout_XMM1_Qa;
    bVar3 = local_440[2];
    uVar30 = (uint)(char)bVar3;
    if ((int)uVar30 < 0) {
      auVar50 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
      auVar50 = pshuflw(auVar50,auVar50,0);
      auVar44._0_4_ = auVar50._0_4_;
      auVar44._4_4_ = auVar44._0_4_;
      auVar44._8_4_ = auVar44._0_4_;
      auVar44._12_4_ = auVar44._0_4_;
      lVar28 = 0;
      do {
        auVar50 = paddsw(*(undefined1 (*) [16])((long)puVar31 + lVar28),auVar44);
        auVar52 = psraw(auVar50,ZEXT416(-uVar30));
        *(undefined1 (*) [16])((long)puVar31 + lVar28) = auVar52;
        lVar28 = lVar28 + 0x10;
      } while (lVar28 != 0x80);
    }
    else if (bVar3 != 0) {
      lVar28 = 0;
      do {
        auVar52 = ZEXT416(uVar30);
        auVar50 = psllw(*(undefined1 (*) [16])((long)puVar31 + lVar28),auVar52);
        *(undefined1 (*) [16])((long)puVar31 + lVar28) = auVar50;
        lVar28 = lVar28 + 0x10;
      } while (lVar28 != 0x80);
    }
    lVar28 = 0;
    do {
      psVar1 = (short *)((long)puVar31 + lVar28);
      sVar6 = psVar1[4];
      sVar7 = psVar1[5];
      sVar8 = psVar1[6];
      sVar9 = psVar1[7];
      auVar55._0_12_ = auVar52._0_12_;
      auVar55._12_2_ = auVar52._6_2_;
      auVar55._14_2_ = psVar1[3];
      auVar54._12_4_ = auVar55._12_4_;
      auVar54._0_10_ = auVar52._0_10_;
      auVar54._10_2_ = psVar1[2];
      auVar53._10_6_ = auVar54._10_6_;
      auVar53._0_8_ = auVar52._0_8_;
      auVar53._8_2_ = auVar52._4_2_;
      auVar27._4_8_ = auVar53._8_8_;
      auVar27._2_2_ = psVar1[1];
      auVar27._0_2_ = auVar52._2_2_;
      auVar52._0_4_ = (int)*psVar1;
      auVar52._4_4_ = auVar27._0_4_ >> 0x10;
      auVar52._8_4_ = auVar53._8_4_ >> 0x10;
      auVar52._12_4_ = auVar54._12_4_ >> 0x10;
      *(undefined1 (*) [16])(piVar33 + lVar28 * 2 + -4) = auVar52;
      piVar2 = piVar33 + lVar28 * 2;
      *piVar2 = (int)sVar6;
      piVar2[1] = (int)sVar7;
      piVar2[2] = (int)sVar8;
      piVar2[3] = (int)sVar9;
      lVar28 = lVar28 + 0x10;
    } while (lVar28 != 0x80);
    lVar32 = lVar32 + 1;
    puVar34 = puVar34 + 0x10;
    piVar33 = piVar33 + 8;
  } while (lVar32 != 4);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_8x32_sse2(const int16_t *input, int32_t *output,
                                    int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[32], buf1[32];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X32];
  const int txw_idx = get_txw_idx(TX_8X32);
  const int txh_idx = get_txh_idx(TX_8X32);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 8;
  const int height = 32;
  const transform_1d_sse2 col_txfm = col_txfm8x32_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x8_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip) {
    load_buffer_16bit_to_16bit_flip(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit(input, stride, buf0, height);
  }
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_8x8(buf0, buf1);
  transpose_16bit_8x8(buf0 + 8, buf1 + 8);
  transpose_16bit_8x8(buf0 + 16, buf1 + 16);
  transpose_16bit_8x8(buf0 + 24, buf1 + 24);

  for (int i = 0; i < 4; i++) {
    __m128i *buf;
    if (lr_flip) {
      buf = buf0;
      flip_buf_sse2(buf1 + width * i, buf, width);
    } else {
      buf = buf1 + width * i;
    }
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w8(buf, output + 8 * i, height, width);
  }
}